

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,table_type *t,
          table_format_info *fmt,comment_type *com,source_location *loc)

{
  size_type sVar1;
  basic_value<toml::type_config> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Hash_node_base *p_Var3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pcVar6;
  basic_value<toml::type_config> *e;
  long *plVar7;
  _Hash_node_base *p_Var8;
  array_type *paVar9;
  table_format_info *ptVar10;
  undefined8 *puVar11;
  pointer this_01;
  _Hash_node_base *p_Var12;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> k;
  undefined1 local_5c8 [32];
  bool local_5a8;
  string_type local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f8;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  source_location local_3f0;
  source_location local_378;
  source_location local_300;
  source_location local_288;
  source_location local_210;
  source_location local_198;
  source_location local_120;
  source_location local_a8;
  
  if (this->force_inline_ == true) {
    if (fmt->fmt == multiline_oneline) {
switchD_0038de95_caseD_3:
      format_ml_inline_table(__return_storage_ptr__,this,t,fmt);
      return __return_storage_ptr__;
    }
switchD_0038de95_caseD_1:
    format_inline_table(__return_storage_ptr__,this,t,fmt);
  }
  else {
    switch(fmt->fmt) {
    case multiline:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      format_keys((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_5c8,this,&this->keys_);
      if (local_5a8 == true) {
        this->current_indent_ = this->current_indent_ + fmt->name_indent;
        format_comments_abi_cxx11_(&local_598,this,com,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_598._M_dataplus._M_p,local_598._M_string_length);
        paVar2 = &local_598.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != paVar2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        format_indent_abi_cxx11_(&local_598,this,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_598._M_dataplus._M_p,local_598._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != paVar2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        this->current_indent_ = this->current_indent_ - fmt->name_indent;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,'[');
        if (local_5a8 == false) {
          std::__throw_bad_optional_access();
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_5c8._0_8_,local_5c8._8_8_);
        local_598._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"]\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_598._M_dataplus._M_p,local_598._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != paVar2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
      }
      if (((local_5a8 & 1U) != 0) &&
         (local_5a8 = false, (undefined1 *)local_5c8._0_8_ != local_5c8 + 0x10)) {
        operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
      }
      format_ml_table((string_type *)local_5c8,this,t,fmt);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,(char *)local_5c8._0_8_,local_5c8._8_8_);
      if ((undefined1 *)local_5c8._0_8_ != local_5c8 + 0x10) {
        operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
      }
      break;
    case oneline:
      goto switchD_0038de95_caseD_1;
    case dotted:
      local_5c8._0_8_ = (pointer)0x0;
      local_5c8._8_8_ = 0;
      local_5c8._16_8_ = 0;
      pbVar5 = (this->keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == pbVar5) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(0xa0);
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,
                   "toml::serializer: dotted table must have its key. use format(key, v)","");
        source_location::source_location(&local_a8,loc);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"here","");
        format_error<>(&local_518,&local_490,&local_a8,&local_410);
        source_location::source_location(&local_288,loc);
        *puVar11 = &PTR__serialization_error_004d0978;
        puVar11[1] = puVar11 + 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p == &local_518.field_2) {
          puVar11[3] = CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                                local_518.field_2._M_local_buf[0]);
          puVar11[4] = local_518.field_2._8_8_;
        }
        else {
          puVar11[1] = local_518._M_dataplus._M_p;
          puVar11[3] = CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                                local_518.field_2._M_local_buf[0]);
        }
        puVar11[2] = local_518._M_string_length;
        local_518._M_string_length = 0;
        local_518.field_2._M_local_buf[0] = '\0';
        paVar2 = &local_288.file_name_.field_2;
        *(undefined4 *)(puVar11 + 0xb) = (undefined4)local_288.last_offset_;
        *(undefined4 *)((long)puVar11 + 0x5c) = local_288.last_offset_._4_4_;
        *(undefined4 *)(puVar11 + 0xc) = (undefined4)local_288.length_;
        *(undefined4 *)((long)puVar11 + 100) = local_288.length_._4_4_;
        *(undefined4 *)(puVar11 + 9) = (undefined4)local_288.last_line_;
        *(undefined4 *)((long)puVar11 + 0x4c) = local_288.last_line_._4_4_;
        *(undefined4 *)(puVar11 + 10) = (undefined4)local_288.last_column_;
        *(undefined4 *)((long)puVar11 + 0x54) = local_288.last_column_._4_4_;
        *(undefined4 *)(puVar11 + 7) = (undefined4)local_288.first_column_;
        *(undefined4 *)((long)puVar11 + 0x3c) = local_288.first_column_._4_4_;
        *(undefined4 *)(puVar11 + 8) = (undefined4)local_288.first_offset_;
        *(undefined4 *)((long)puVar11 + 0x44) = local_288.first_offset_._4_4_;
        puVar11[5] = local_288._0_8_;
        puVar11[6] = local_288.first_line_;
        puVar11[0xd] = puVar11 + 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288.file_name_._M_dataplus._M_p == paVar2) {
          puVar11[0xf] = CONCAT71(local_288.file_name_.field_2._M_allocated_capacity._1_7_,
                                  local_288.file_name_.field_2._M_local_buf[0]);
          puVar11[0x10] = local_288.file_name_.field_2._8_8_;
        }
        else {
          puVar11[0xd] = local_288.file_name_._M_dataplus._M_p;
          puVar11[0xf] = CONCAT71(local_288.file_name_.field_2._M_allocated_capacity._1_7_,
                                  local_288.file_name_.field_2._M_local_buf[0]);
        }
        puVar11[0xe] = local_288.file_name_._M_string_length;
        local_288.file_name_._M_string_length = 0;
        local_288.file_name_.field_2._M_local_buf[0] = '\0';
        puVar11[0x11] =
             local_288.line_str_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        puVar11[0x12] =
             local_288.line_str_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        puVar11[0x13] =
             local_288.line_str_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_288.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        local_288.file_name_._M_dataplus._M_p = (pointer)paVar2;
        __cxa_throw(puVar11,&serialization_error::typeinfo,serialization_error::~serialization_error
                   );
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5c8,pbVar5 + -1);
      format_dotted_table(__return_storage_ptr__,this,t,fmt,loc,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_5c8);
      sVar1 = local_5c8._8_8_ - 0x20;
      puVar11 = (undefined8 *)(local_5c8._8_8_ - 0x20);
      plVar7 = (long *)(local_5c8._8_8_ - 0x10);
      local_5c8._8_8_ = sVar1;
      if ((long *)*puVar11 != plVar7) {
        operator_delete((long *)*puVar11,*plVar7 + 1);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5c8);
      break;
    case multiline_oneline:
      goto switchD_0038de95_caseD_3;
    default:
      local_4f8 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_4f8;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      p_Var12 = (t->_M_h)._M_before_begin._M_nxt;
      if (p_Var12 != (_Hash_node_base *)0x0) {
        do {
          this_00 = (basic_value<toml::type_config> *)(p_Var12 + 5);
          if (*(char *)&p_Var12[5]._M_nxt == '\n') {
            ptVar10 = basic_value<toml::type_config>::as_table_fmt(this_00);
            if ((ptVar10->fmt != multiline) &&
               (ptVar10 = basic_value<toml::type_config>::as_table_fmt(this_00),
               ptVar10->fmt != implicit)) {
              puVar11 = (undefined8 *)__cxa_allocate_exception(0xa0);
              local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4d0,
                         "toml::serializer: an implicit table cannot have non-multiline table","");
              source_location::source_location(&local_198,(region *)(p_Var12 + 0xe));
              local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"here","");
              format_error<>(&local_558,&local_4d0,&local_198,&local_450);
              source_location::source_location(&local_378,(region *)(p_Var12 + 0xe));
              *puVar11 = &PTR__serialization_error_004d0978;
              puVar11[1] = puVar11 + 3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_558._M_dataplus._M_p == &local_558.field_2) {
                puVar11[3] = CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                                      local_558.field_2._M_local_buf[0]);
                puVar11[4] = local_558.field_2._8_8_;
              }
              else {
                puVar11[1] = local_558._M_dataplus._M_p;
                puVar11[3] = CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                                      local_558.field_2._M_local_buf[0]);
              }
              puVar11[2] = local_558._M_string_length;
              local_558._M_string_length = 0;
              local_558.field_2._M_local_buf[0] = '\0';
              paVar2 = &local_378.file_name_.field_2;
              *(undefined4 *)(puVar11 + 0xb) = (undefined4)local_378.last_offset_;
              *(undefined4 *)((long)puVar11 + 0x5c) = local_378.last_offset_._4_4_;
              *(undefined4 *)(puVar11 + 0xc) = (undefined4)local_378.length_;
              *(undefined4 *)((long)puVar11 + 100) = local_378.length_._4_4_;
              *(undefined4 *)(puVar11 + 9) = (undefined4)local_378.last_line_;
              *(undefined4 *)((long)puVar11 + 0x4c) = local_378.last_line_._4_4_;
              *(undefined4 *)(puVar11 + 10) = (undefined4)local_378.last_column_;
              *(undefined4 *)((long)puVar11 + 0x54) = local_378.last_column_._4_4_;
              *(undefined4 *)(puVar11 + 7) = (undefined4)local_378.first_column_;
              *(undefined4 *)((long)puVar11 + 0x3c) = local_378.first_column_._4_4_;
              *(undefined4 *)(puVar11 + 8) = (undefined4)local_378.first_offset_;
              *(undefined4 *)((long)puVar11 + 0x44) = local_378.first_offset_._4_4_;
              puVar11[5] = local_378._0_8_;
              puVar11[6] = local_378.first_line_;
              puVar11[0xd] = puVar11 + 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378.file_name_._M_dataplus._M_p == paVar2) {
                puVar11[0xf] = CONCAT71(local_378.file_name_.field_2._M_allocated_capacity._1_7_,
                                        local_378.file_name_.field_2._M_local_buf[0]);
                puVar11[0x10] = local_378.file_name_.field_2._8_8_;
              }
              else {
                puVar11[0xd] = local_378.file_name_._M_dataplus._M_p;
                puVar11[0xf] = CONCAT71(local_378.file_name_.field_2._M_allocated_capacity._1_7_,
                                        local_378.file_name_.field_2._M_local_buf[0]);
              }
              puVar11[0xe] = local_378.file_name_._M_string_length;
              local_378.file_name_._M_string_length = 0;
              local_378.file_name_.field_2._M_local_buf[0] = '\0';
              puVar11[0x11] =
                   local_378.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              puVar11[0x12] =
                   local_378.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              puVar11[0x13] =
                   local_378.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_378.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_378.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_378.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
              local_378.file_name_._M_dataplus._M_p = (pointer)paVar2;
              __cxa_throw(puVar11,&serialization_error::typeinfo,
                          serialization_error::~serialization_error);
            }
          }
          else {
            if (*(char *)&p_Var12[5]._M_nxt != '\t') {
LAB_0038e259:
              puVar11 = (undefined8 *)__cxa_allocate_exception(0xa0);
              local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4b0,
                         "toml::serializer: an implicit table cannot have non-table value.","");
              source_location::source_location(&local_120,(region *)(p_Var12 + 0xe));
              local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"here","");
              format_error<>(&local_538,&local_4b0,&local_120,&local_430);
              source_location::source_location(&local_300,(region *)(p_Var12 + 0xe));
              *puVar11 = &PTR__serialization_error_004d0978;
              puVar11[1] = puVar11 + 3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p == &local_538.field_2) {
                puVar11[3] = CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                                      local_538.field_2._M_local_buf[0]);
                puVar11[4] = local_538.field_2._8_8_;
              }
              else {
                puVar11[1] = local_538._M_dataplus._M_p;
                puVar11[3] = CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                                      local_538.field_2._M_local_buf[0]);
              }
              puVar11[2] = local_538._M_string_length;
              local_538._M_string_length = 0;
              local_538.field_2._M_local_buf[0] = '\0';
              paVar2 = &local_300.file_name_.field_2;
              *(undefined4 *)(puVar11 + 0xb) = (undefined4)local_300.last_offset_;
              *(undefined4 *)((long)puVar11 + 0x5c) = local_300.last_offset_._4_4_;
              *(undefined4 *)(puVar11 + 0xc) = (undefined4)local_300.length_;
              *(undefined4 *)((long)puVar11 + 100) = local_300.length_._4_4_;
              *(undefined4 *)(puVar11 + 9) = (undefined4)local_300.last_line_;
              *(undefined4 *)((long)puVar11 + 0x4c) = local_300.last_line_._4_4_;
              *(undefined4 *)(puVar11 + 10) = (undefined4)local_300.last_column_;
              *(undefined4 *)((long)puVar11 + 0x54) = local_300.last_column_._4_4_;
              *(undefined4 *)(puVar11 + 7) = (undefined4)local_300.first_column_;
              *(undefined4 *)((long)puVar11 + 0x3c) = local_300.first_column_._4_4_;
              *(undefined4 *)(puVar11 + 8) = (undefined4)local_300.first_offset_;
              *(undefined4 *)((long)puVar11 + 0x44) = local_300.first_offset_._4_4_;
              puVar11[5] = local_300._0_8_;
              puVar11[6] = local_300.first_line_;
              puVar11[0xd] = puVar11 + 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300.file_name_._M_dataplus._M_p == paVar2) {
                puVar11[0xf] = CONCAT71(local_300.file_name_.field_2._M_allocated_capacity._1_7_,
                                        local_300.file_name_.field_2._M_local_buf[0]);
                puVar11[0x10] = local_300.file_name_.field_2._8_8_;
              }
              else {
                puVar11[0xd] = local_300.file_name_._M_dataplus._M_p;
                puVar11[0xf] = CONCAT71(local_300.file_name_.field_2._M_allocated_capacity._1_7_,
                                        local_300.file_name_.field_2._M_local_buf[0]);
              }
              puVar11[0xe] = local_300.file_name_._M_string_length;
              local_300.file_name_._M_string_length = 0;
              local_300.file_name_.field_2._M_local_buf[0] = '\0';
              puVar11[0x11] =
                   local_300.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              puVar11[0x12] =
                   local_300.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              puVar11[0x13] =
                   local_300.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_300.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_300.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_300.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              local_300.file_name_._M_dataplus._M_p = (pointer)paVar2;
              __cxa_throw(puVar11,&serialization_error::typeinfo,
                          serialization_error::~serialization_error);
            }
            p_Var8 = (p_Var12[6]._M_nxt)->_M_nxt;
            p_Var3 = p_Var12[6]._M_nxt[1]._M_nxt;
            if (p_Var8 == p_Var3) goto LAB_0038e259;
            do {
              if (*(char *)&p_Var8->_M_nxt != '\n') goto LAB_0038e259;
              p_Var8 = p_Var8 + 0x19;
            } while (p_Var8 != p_Var3);
            paVar9 = basic_value<toml::type_config>::as_array(this_00);
            pbVar4 = (paVar9->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (this_01 = (paVar9->
                           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; this_01 != pbVar4;
                this_01 = this_01 + 1) {
              ptVar10 = basic_value<toml::type_config>::as_table_fmt(this_01);
              if ((ptVar10->fmt != multiline) &&
                 (ptVar10 = basic_value<toml::type_config>::as_table_fmt(this_00),
                 ptVar10->fmt != implicit)) {
                puVar11 = (undefined8 *)__cxa_allocate_exception(0xa0);
                local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4f0,
                           "toml::serializer: an implicit table cannot have non-multiline table","")
                ;
                source_location::source_location(&local_210,&this_01->region_);
                local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"here","");
                format_error<>(&local_578,&local_4f0,&local_210,&local_470);
                source_location::source_location(&local_3f0,&this_01->region_);
                *puVar11 = &PTR__serialization_error_004d0978;
                puVar11[1] = puVar11 + 3;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_578._M_dataplus._M_p == &local_578.field_2) {
                  puVar11[3] = CONCAT71(local_578.field_2._M_allocated_capacity._1_7_,
                                        local_578.field_2._M_local_buf[0]);
                  puVar11[4] = local_578.field_2._8_8_;
                }
                else {
                  puVar11[1] = local_578._M_dataplus._M_p;
                  puVar11[3] = CONCAT71(local_578.field_2._M_allocated_capacity._1_7_,
                                        local_578.field_2._M_local_buf[0]);
                }
                puVar11[2] = local_578._M_string_length;
                local_578._M_string_length = 0;
                local_578.field_2._M_local_buf[0] = '\0';
                paVar2 = &local_3f0.file_name_.field_2;
                *(undefined4 *)(puVar11 + 0xb) = (undefined4)local_3f0.last_offset_;
                *(undefined4 *)((long)puVar11 + 0x5c) = local_3f0.last_offset_._4_4_;
                *(undefined4 *)(puVar11 + 0xc) = (undefined4)local_3f0.length_;
                *(undefined4 *)((long)puVar11 + 100) = local_3f0.length_._4_4_;
                *(undefined4 *)(puVar11 + 9) = (undefined4)local_3f0.last_line_;
                *(undefined4 *)((long)puVar11 + 0x4c) = local_3f0.last_line_._4_4_;
                *(undefined4 *)(puVar11 + 10) = (undefined4)local_3f0.last_column_;
                *(undefined4 *)((long)puVar11 + 0x54) = local_3f0.last_column_._4_4_;
                *(undefined4 *)(puVar11 + 7) = (undefined4)local_3f0.first_column_;
                *(undefined4 *)((long)puVar11 + 0x3c) = local_3f0.first_column_._4_4_;
                *(undefined4 *)(puVar11 + 8) = (undefined4)local_3f0.first_offset_;
                *(undefined4 *)((long)puVar11 + 0x44) = local_3f0.first_offset_._4_4_;
                puVar11[5] = local_3f0._0_8_;
                puVar11[6] = local_3f0.first_line_;
                puVar11[0xd] = puVar11 + 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f0.file_name_._M_dataplus._M_p == paVar2) {
                  puVar11[0xf] = CONCAT71(local_3f0.file_name_.field_2._M_allocated_capacity._1_7_,
                                          local_3f0.file_name_.field_2._M_local_buf[0]);
                  puVar11[0x10] = local_3f0.file_name_.field_2._8_8_;
                }
                else {
                  puVar11[0xd] = local_3f0.file_name_._M_dataplus._M_p;
                  puVar11[0xf] = CONCAT71(local_3f0.file_name_.field_2._M_allocated_capacity._1_7_,
                                          local_3f0.file_name_.field_2._M_local_buf[0]);
                }
                puVar11[0xe] = local_3f0.file_name_._M_string_length;
                local_3f0.file_name_._M_string_length = 0;
                local_3f0.file_name_.field_2._M_local_buf[0] = '\0';
                puVar11[0x11] =
                     local_3f0.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                puVar11[0x12] =
                     local_3f0.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                puVar11[0x13] =
                     local_3f0.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_3f0.line_str_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_3f0.line_str_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_3f0.line_str_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
                local_3f0.file_name_._M_dataplus._M_p = (pointer)paVar2;
                __cxa_throw(puVar11,&serialization_error::typeinfo,
                            serialization_error::~serialization_error);
              }
            }
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->keys_,(value_type *)(p_Var12 + 1));
          operator()[abi_cxx11_((string_type *)local_5c8,this,this_00);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,(char *)local_5c8._0_8_,local_5c8._8_8_);
          if ((undefined1 *)local_5c8._0_8_ != local_5c8 + 0x10) {
            operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
          }
          pbVar5 = (this->keys_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar5 + -1;
          pcVar6 = pbVar5[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != &pbVar5[-1].field_2) {
            operator_delete(pcVar6,pbVar5[-1].field_2._M_allocated_capacity + 1);
          }
          p_Var12 = p_Var12->_M_nxt;
        } while (p_Var12 != (_Hash_node_base *)0x0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const table_type& t, const table_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        if(this->force_inline_)
        {
            if(fmt.fmt == table_format::multiline_oneline)
            {
                return this->format_ml_inline_table(t, fmt);
            }
            else
            {
                return this->format_inline_table(t, fmt);
            }
        }
        else
        {
            if(fmt.fmt == table_format::multiline)
            {
                string_type retval;
                // comment is emitted inside format_ml_table
                if(auto k = this->format_keys(this->keys_))
                {
                    this->current_indent_ += fmt.name_indent;
                    retval += this->format_comments(com, fmt.indent_type);
                    retval += this->format_indent(fmt.indent_type);
                    this->current_indent_ -= fmt.name_indent;
                    retval += char_type('[');
                    retval += k.value();
                    retval += string_conv<string_type>("]\n");
                }
                // otherwise, its the root.

                retval += this->format_ml_table(t, fmt);
                return retval;
            }
            else if(fmt.fmt == table_format::oneline)
            {
                return this->format_inline_table(t, fmt);
            }
            else if(fmt.fmt == table_format::multiline_oneline)
            {
                return this->format_ml_inline_table(t, fmt);
            }
            else if(fmt.fmt == table_format::dotted)
            {
                std::vector<string_type> keys;
                if(this->keys_.empty())
                {
                    throw serialization_error(format_error("toml::serializer: "
                        "dotted table must have its key. use format(key, v)",
                        loc, "here"), loc);
                }
                keys.push_back(this->keys_.back());

                const auto retval = this->format_dotted_table(t, fmt, loc, keys);
                keys.pop_back();
                return retval;
            }
            else
            {
                assert(fmt.fmt == table_format::implicit);

                string_type retval;
                for(const auto& kv : t)
                {
                    const auto& k = kv.first;
                    const auto& v = kv.second;

                    if( ! v.is_table() && ! v.is_array_of_tables())
                    {
                        throw serialization_error(format_error("toml::serializer: "
                            "an implicit table cannot have non-table value.",
                            v.location(), "here"), v.location());
                    }
                    if(v.is_table())
                    {
                        if(v.as_table_fmt().fmt != table_format::multiline &&
                           v.as_table_fmt().fmt != table_format::implicit)
                        {
                            throw serialization_error(format_error("toml::serializer: "
                                "an implicit table cannot have non-multiline table",
                                v.location(), "here"), v.location());
                        }
                    }
                    else
                    {
                        assert(v.is_array());
                        for(const auto& e : v.as_array())
                        {
                            if(e.as_table_fmt().fmt != table_format::multiline &&
                               v.as_table_fmt().fmt != table_format::implicit)
                            {
                                throw serialization_error(format_error("toml::serializer: "
                                    "an implicit table cannot have non-multiline table",
                                    e.location(), "here"), e.location());
                            }
                        }
                    }

                    keys_.push_back(k);
                    retval += (*this)(v);
                    keys_.pop_back();
                }
                return retval;
            }
        }
    }